

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O2

QString * funcCall(QString *__return_storage_ptr__,Command *c,int idx)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  TypedName *a;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_50.d = (Data *)0x0;
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_50.ptr = L"void";
  local_68.size = 0;
  local_50.size = 4;
  bVar1 = comparesEqual(&(c->cmd).type,(QString *)&local_50);
  pcVar2 = "return ";
  if (bVar1) {
    pcVar2 = "";
  }
  QString::toLocal8Bit((QByteArray *)&local_80,(QString *)c);
  if (local_80.ptr == (char *)0x0) {
    local_80.ptr = (char *)&QByteArray::_empty;
  }
  QString::asprintf((char *)__return_storage_ptr__,"%sreinterpret_cast<PFN_%s>(d_ptr->m_funcs[%d])",
                    pcVar2,local_80.ptr,(ulong)(uint)idx);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  if ((c->args).d.size != 0) {
    QString::append((QChar)(char16_t)__return_storage_ptr__);
    bVar1 = true;
    for (lVar3 = (c->args).d.size * 0x48; lVar3 != 0; lVar3 = lVar3 + -0x48) {
      if (!bVar1) {
        local_68.d = (Data *)0x0;
        local_68.ptr = (char16_t *)0x0;
        local_50.d = (Data *)0x0;
        local_50.ptr = L", ";
        local_68.size = 0;
        local_50.size = 2;
        QString::append(__return_storage_ptr__);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      }
      QString::append(__return_storage_ptr__);
      bVar1 = false;
    }
    QString::append((QChar)(char16_t)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString funcCall(const VkSpecParser::Command &c, int idx)
{
    // template:
    //     [return] reinterpret_cast<PFN_vkEnumeratePhysicalDevices>(d_ptr->m_funcs[0])(instance, pPhysicalDeviceCount, pPhysicalDevices);
    QString s = QString::asprintf("%sreinterpret_cast<PFN_%s>(d_ptr->m_funcs[%d])",
                                  (c.cmd.type == QStringLiteral("void") ? "" : "return "),
                                  qPrintable(c.cmd.name),
                                  idx);
    if (!c.args.isEmpty()) {
        s += u'(';
        bool first = true;
        for (const VkSpecParser::TypedName &a : c.args) {
            if (!first)
                s += QStringLiteral(", ");
            else
                first = false;
            s += a.name;
        }
        s += u')';
    }
    return s;
}